

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

bool __thiscall
crnlib::
hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
::insert_no_grow(hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
                 *this,insert_result *result,vec<2U,_float> *k,uint *v)

{
  float fVar1;
  raw_node *prVar2;
  bool bVar3;
  uint32 uVar4;
  raw_node *prVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar4 = fast_hash(k,8);
  uVar6 = uVar4 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
  prVar2 = (this->m_values).m_p;
  prVar5 = prVar2 + uVar6;
  if (prVar2[uVar6].m_bits[0xc] != '\0') {
    fVar1 = k->m_s[0];
    if ((*(float *)prVar5->m_bits == fVar1) && (!NAN(*(float *)prVar5->m_bits) && !NAN(fVar1))) {
      bVar11 = false;
      do {
        bVar10 = bVar11;
        if (bVar10) goto LAB_00191f93;
      } while ((*(float *)(prVar5->m_bits + 4) == k->m_s[1]) &&
              (bVar11 = true, !NAN(*(float *)(prVar5->m_bits + 4)) && !NAN(k->m_s[1])));
      if (bVar10) {
LAB_00191f93:
        bVar11 = false;
        goto LAB_00192051;
      }
    }
    uVar9 = (this->m_values).m_size - 1;
    uVar8 = (ulong)(uVar6 - 1);
    if (uVar6 == 0) {
      uVar8 = (ulong)uVar9;
    }
    uVar7 = (uint)uVar8;
    prVar5 = prVar5 + -1;
    if (uVar6 == 0) {
      prVar5 = prVar2 + uVar9;
    }
    if (uVar6 == uVar7) {
      bVar11 = false;
    }
    else {
      do {
        uVar7 = (uint)uVar8;
        bVar11 = prVar5->m_bits[0xc] == '\0';
        if (bVar11) break;
        if ((*(float *)prVar5->m_bits == fVar1) && (!NAN(*(float *)prVar5->m_bits) && !NAN(fVar1)))
        {
          bVar10 = false;
          do {
            bVar3 = bVar10;
            if (bVar3) goto LAB_0019201b;
          } while ((*(float *)(prVar5->m_bits + 4) == k->m_s[1]) &&
                  (bVar10 = true, !NAN(*(float *)(prVar5->m_bits + 4)) && !NAN(k->m_s[1])));
          if (bVar3) {
LAB_0019201b:
            (result->first).m_pTable = this;
            (result->first).m_index = uVar7;
            result->second = false;
            bVar10 = true;
            bVar11 = false;
            uVar6 = uVar7;
            goto LAB_00192029;
          }
        }
        bVar10 = uVar7 == 0;
        uVar7 = uVar7 - 1;
        if (bVar10) {
          uVar7 = uVar9;
        }
        uVar8 = (ulong)uVar7;
        prVar5 = prVar5 + -1;
        if (bVar10) {
          prVar5 = prVar2 + uVar9;
        }
      } while (uVar6 != uVar7);
    }
    bVar10 = false;
    uVar6 = uVar7;
LAB_00192029:
    if (!bVar11) {
      return bVar10;
    }
  }
  if (this->m_grow_threshold <= this->m_num_valid) {
    return false;
  }
  *(undefined8 *)prVar5->m_bits = *(undefined8 *)k->m_s;
  *(uint *)(prVar5->m_bits + 8) = *v;
  prVar5->m_bits[0xc] = '\x01';
  this->m_num_valid = this->m_num_valid + 1;
  bVar11 = true;
LAB_00192051:
  (result->first).m_pTable = this;
  (result->first).m_index = uVar6;
  result->second = bVar11;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value()) {
    if (!m_values.size())
      return false;

    int index = hash_key(k);
    node* pNode = &get_node(index);

    if (pNode->state) {
      if (m_equals(pNode->first, k)) {
        result.first = iterator(*this, index);
        result.second = false;
        return true;
      }

      const int orig_index = index;

      for (;;) {
        if (!index) {
          index = m_values.size() - 1;
          pNode = &get_node(index);
        } else {
          index--;
          pNode--;
        }

        if (orig_index == index)
          return false;

        if (!pNode->state)
          break;

        if (m_equals(pNode->first, k)) {
          result.first = iterator(*this, index);
          result.second = false;
          return true;
        }
      }
    }

    if (m_num_valid >= m_grow_threshold)
      return false;

    construct_value_type(pNode, k, v);

    pNode->state = cStateValid;

    m_num_valid++;
    CRNLIB_ASSERT(m_num_valid <= m_values.size());

    result.first = iterator(*this, index);
    result.second = true;

    return true;
  }